

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O0

String * kj::stringifyStackTrace(String *__return_storage_ptr__,ArrayPtr<void_*const> trace)

{
  long lVar1;
  int iVar2;
  size_t sVar3;
  ExceptionCallback *pEVar4;
  char *pcVar5;
  size_t sVar6;
  ArrayDisposer **delim;
  size_t extraout_RDX;
  char (*params_2) [17];
  String *in_R9;
  bool bVar7;
  ArrayPtr<const_char> AVar8;
  StringPtr filename;
  ArrayDisposer **local_6d0;
  String *local_648;
  ArrayPtr<kj::String> local_630;
  StringPtr local_620;
  ArrayPtr<const_char> local_610;
  String local_600;
  size_t local_5e8;
  size_t len;
  size_t i;
  char line [512];
  __pid_t local_3cc;
  String local_3c8;
  undefined4 local_3ac;
  undefined1 local_3a8 [8];
  String strTrace;
  FILE *p;
  String lines [32];
  undefined1 local_80 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_exception_c__:257:3)>
  _kjDefer257;
  undefined1 local_48 [8];
  String oldPreload;
  char *preload;
  undefined1 auStack_20 [6];
  Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_exception_c__:248:3)>
  _kjDefer248;
  ArrayPtr<void_*const> trace_local;
  
  _auStack_20 = trace.ptr;
  sVar3 = ArrayPtr<void_*const>::size((ArrayPtr<void_*const> *)auStack_20);
  if (sVar3 == 0) {
    String::String(__return_storage_ptr__,(void *)0x0);
  }
  else {
    pEVar4 = getExceptionCallback();
    iVar2 = (*pEVar4->_vptr_ExceptionCallback[5])();
    if (iVar2 == 0) {
      pthread_mutex_lock((pthread_mutex_t *)&stringifyStackTrace::mutex);
      defer<kj::stringifyStackTrace(kj::ArrayPtr<void*const>)::__0>
                ((kj *)((long)&preload + 6),(Type *)((long)&preload + 5));
      oldPreload.content.disposer = (ArrayDisposer *)getenv("LD_PRELOAD");
      String::String((String *)local_48);
      if (oldPreload.content.disposer != (ArrayDisposer *)0x0) {
        heapString((String *)&_kjDefer257.canceled,(char *)oldPreload.content.disposer);
        String::operator=((String *)local_48,(String *)&_kjDefer257.canceled);
        String::~String((String *)&_kjDefer257.canceled);
        unsetenv("LD_PRELOAD");
      }
      lines[0x1f].content.disposer = (ArrayDisposer *)local_48;
      defer<kj::stringifyStackTrace(kj::ArrayPtr<void*const>)::__1>
                ((kj *)local_80,(Type *)&lines[0x1f].content.disposer);
      local_648 = (String *)&p;
      delim = &lines[0x1f].content.disposer;
      do {
        String::String(local_648);
        local_648 = local_648 + 1;
      } while (local_648 != (String *)delim);
      strTrace.content.disposer = (ArrayDisposer *)0x0;
      strArray<kj::ArrayPtr<void*const>&>
                ((String *)local_3a8,(kj *)auStack_20,(ArrayPtr<void_*const> *)0x26d581,
                 (char *)delim);
      iVar2 = access("/proc/self/exe",4);
      if (iVar2 < 0) {
        String::String(__return_storage_ptr__,(void *)0x0);
      }
      else {
        local_3cc = getpid();
        params_2 = (char (*) [17])local_3a8;
        str<char_const(&)[20],int,char_const(&)[6],kj::String&>
                  (&local_3c8,(kj *)"addr2line -e /proc/",(char (*) [20])&local_3cc,(int *)"/exe ",
                   (char (*) [6])params_2,in_R9);
        pcVar5 = String::cStr(&local_3c8);
        strTrace.content.disposer = (ArrayDisposer *)popen(pcVar5,"r");
        String::~String(&local_3c8);
        if (strTrace.content.disposer == (ArrayDisposer *)0x0) {
          String::String(__return_storage_ptr__,(void *)0x0);
        }
        else {
          len = 0;
          while( true ) {
            sVar3 = len;
            sVar6 = size<kj::String,32ul>((String (*) [32])&p);
            bVar7 = false;
            if (sVar3 < sVar6) {
              pcVar5 = fgets((char *)&i,0x200,(FILE *)strTrace.content.disposer);
              bVar7 = pcVar5 != (char *)0x0;
            }
            if (!bVar7) break;
            pcVar5 = strstr((char *)&i,"kj/common.c++");
            if (pcVar5 == (char *)0x0) {
              pcVar5 = strstr((char *)&i,"kj/exception.");
              if (pcVar5 == (char *)0x0) {
                pcVar5 = strstr((char *)&i,"kj/debug.");
                if (pcVar5 == (char *)0x0) {
                  pcVar5 = strstr((char *)&i,"kj/async.");
                  if (pcVar5 == (char *)0x0) {
                    pcVar5 = strstr((char *)&i,"kj/async-prelude.h");
                    if (pcVar5 == (char *)0x0) {
                      pcVar5 = strstr((char *)&i,"kj/async-inl.h");
                      if (pcVar5 == (char *)0x0) {
                        pcVar5 = strstr((char *)&i,"kj::Exception");
                        if (pcVar5 == (char *)0x0) {
                          pcVar5 = strstr((char *)&i,"kj::_::Debug");
                          if (pcVar5 == (char *)0x0) {
                            local_5e8 = strlen((char *)&i);
                            if ((local_5e8 != 0) && (*(char *)((long)&len + local_5e8 + 7) == '\n'))
                            {
                              *(undefined1 *)((long)&len + local_5e8 + 7) = 0;
                            }
                            StringPtr::StringPtr(&local_620,(char *)&i);
                            filename.content.size_ = extraout_RDX;
                            filename.content.ptr = (char *)local_620.content.size_;
                            AVar8 = (ArrayPtr<const_char>)
                                    trimSourceFilename((kj *)local_620.content.ptr,filename);
                            local_610 = AVar8;
                            str<char_const(&)[6],kj::StringPtr,char_const(&)[17]>
                                      (&local_600,(kj *)"\n    ",(char (*) [6])&local_610,
                                       (StringPtr *)": returning here",params_2);
                            lVar1 = len - 1;
                            len = len + 1;
                            String::operator=((String *)&lines[lVar1].content.disposer,&local_600);
                            String::~String(&local_600);
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          do {
            pcVar5 = fgets((char *)&i,0x200,(FILE *)strTrace.content.disposer);
          } while (pcVar5 != (char *)0x0);
          pclose((FILE *)strTrace.content.disposer);
          local_630 = arrayPtr<kj::String>((String *)&p,len);
          strArray<kj::ArrayPtr<kj::String>>
                    (__return_storage_ptr__,(kj *)&local_630,(ArrayPtr<kj::String> *)0x26f602,
                     (char *)local_630.ptr);
        }
      }
      local_3ac = 1;
      String::~String((String *)local_3a8);
      local_6d0 = &lines[0x1f].content.disposer;
      do {
        local_6d0 = local_6d0 + -3;
        String::~String((String *)local_6d0);
      } while ((FILE **)local_6d0 != &p);
      _::
      Deferred<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/exception.c++:257:3)>
      ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_exception_c__:257:3)>
                   *)local_80);
      String::~String((String *)local_48);
      _::
      Deferred<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/exception.c++:248:3)>
      ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_exception_c__:248:3)>
                   *)((long)&preload + 6));
    }
    else {
      String::String(__return_storage_ptr__,(void *)0x0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

String stringifyStackTrace(ArrayPtr<void* const> trace) {
  if (trace.size() == 0) return nullptr;
  if (getExceptionCallback().stackTraceMode() != ExceptionCallback::StackTraceMode::FULL) {
    return nullptr;
  }

#if _WIN32 && _M_X64 && _MSC_VER

  // Try to get file/line using SymGetLineFromAddr64(). We don't bother if we aren't on MSVC since
  // this requires MSVC debug info.
  //
  // TODO(someday): We could perhaps shell out to addr2line on MinGW.

  const Dbghelp& dbghelp = getDbghelp();
  if (dbghelp.symGetLineFromAddr64 == nullptr) return nullptr;

  HANDLE process = GetCurrentProcess();

  KJ_STACK_ARRAY(String, lines, trace.size(), 32, 32);

  for (auto i: kj::indices(trace)) {
    IMAGEHLP_LINE64 lineInfo;
    memset(&lineInfo, 0, sizeof(lineInfo));
    lineInfo.SizeOfStruct = sizeof(lineInfo);
    if (dbghelp.symGetLineFromAddr64(process, reinterpret_cast<DWORD64>(trace[i]), NULL, &lineInfo)) {
      lines[i] = kj::str('\n', lineInfo.FileName, ':', lineInfo.LineNumber);
    }
  }

  return strArray(lines, "");

#elif (__linux__ || __APPLE__) && !__ANDROID__
  // We want to generate a human-readable stack trace.

  // TODO(someday):  It would be really great if we could avoid farming out to another process
  //   and do this all in-process, but that may involve onerous requirements like large library
  //   dependencies or using -rdynamic.

  // The environment manipulation is not thread-safe, so lock a mutex.  This could still be
  // problematic if another thread is manipulating the environment in unrelated code, but there's
  // not much we can do about that.  This is debug-only anyway and only an issue when LD_PRELOAD
  // is in use.
  static pthread_mutex_t mutex = PTHREAD_MUTEX_INITIALIZER;
  pthread_mutex_lock(&mutex);
  KJ_DEFER(pthread_mutex_unlock(&mutex));

  // Don't heapcheck / intercept syscalls.
  const char* preload = getenv("LD_PRELOAD");
  String oldPreload;
  if (preload != nullptr) {
    oldPreload = heapString(preload);
    unsetenv("LD_PRELOAD");
  }
  KJ_DEFER(if (oldPreload != nullptr) { setenv("LD_PRELOAD", oldPreload.cStr(), true); });

  String lines[32];
  FILE* p = nullptr;
  auto strTrace = strArray(trace, " ");

#if __linux__
  if (access("/proc/self/exe", R_OK) < 0) {
    // Apparently /proc is not available?
    return nullptr;
  }

  // Obtain symbolic stack trace using addr2line.
  // TODO(cleanup): Use fork() and exec() or maybe our own Subprocess API (once it exists), to
  //   avoid depending on a shell.
  p = popen(str("addr2line -e /proc/", getpid(), "/exe ", strTrace).cStr(), "r");
#elif __APPLE__
  // The Mac OS X equivalent of addr2line is atos.
  // (Internally, it uses the private CoreSymbolication.framework library.)
  p = popen(str("xcrun atos -p ", getpid(), ' ', strTrace).cStr(), "r");
#endif

  if (p == nullptr) {
    return nullptr;
  }

  char line[512];
  size_t i = 0;
  while (i < kj::size(lines) && fgets(line, sizeof(line), p) != nullptr) {
    // Don't include exception-handling infrastructure or promise infrastructure in stack trace.
    // addr2line output matches file names; atos output matches symbol names.
    if (strstr(line, "kj/common.c++") != nullptr ||
        strstr(line, "kj/exception.") != nullptr ||
        strstr(line, "kj/debug.") != nullptr ||
        strstr(line, "kj/async.") != nullptr ||
        strstr(line, "kj/async-prelude.h") != nullptr ||
        strstr(line, "kj/async-inl.h") != nullptr ||
        strstr(line, "kj::Exception") != nullptr ||
        strstr(line, "kj::_::Debug") != nullptr) {
      continue;
    }

    size_t len = strlen(line);
    if (len > 0 && line[len-1] == '\n') line[len-1] = '\0';
    lines[i++] = str("\n    ", trimSourceFilename(line), ": returning here");
  }

  // Skip remaining input.
  while (fgets(line, sizeof(line), p) != nullptr) {}

  pclose(p);

  return strArray(arrayPtr(lines, i), "");

#else
  return nullptr;
#endif
}